

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_attr_set_v2d(exr_context_t ctxt,int part_index,char *name,exr_attr_v2d_t *val)

{
  pthread_mutex_t *__mutex;
  exr_attr_box2i_t *peVar1;
  exr_attr_v2i_t eVar2;
  exr_result_t eVar3;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  char *pcVar4;
  exr_context_t nonc;
  char *pcVar5;
  exr_attribute_list_t *list;
  exr_result_t eStackY_50;
  exr_attribute_t *attr;
  
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar3 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar3;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 0x15;
LAB_0011e728:
    eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStackY_50);
    return eVar3;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 8;
    goto LAB_0011e728;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar3 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
  if (eVar3 == 0) {
    if (attr->type != EXR_ATTR_V2D) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar5 = attr->type_name;
      pcVar4 = "\'%s\' requested type \'v2d\', but stored attributes is type \'%s\'";
      eVar3 = 0x10;
      goto LAB_0011e80d;
    }
    if (val == (exr_attr_v2d_t *)0x0) goto LAB_0011e7f5;
  }
  else {
    if (eVar3 != 0xf) goto LAB_0011e7cc;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar3 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_V2D,0,(uint8_t **)0x0,&attr);
    if (val == (exr_attr_v2d_t *)0x0) {
LAB_0011e7f5:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar4 = "No input value for setting \'%s\', type \'%s\'";
      pcVar5 = "v2d";
      eVar3 = 3;
LAB_0011e80d:
      eVar3 = (*ctxt->print_error)(ctxt,eVar3,pcVar4,name,pcVar5);
      return eVar3;
    }
    if (eVar3 != 0) goto LAB_0011e7cc;
  }
  peVar1 = (attr->field_6).box2i;
  eVar2 = (exr_attr_v2i_t)val->y;
  peVar1->min = (exr_attr_v2i_t)val->x;
  peVar1->max = eVar2;
  eVar3 = 0;
LAB_0011e7cc:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_set_v2d (
    exr_context_t         ctxt,
    int                   part_index,
    const char*           name,
    const exr_attr_v2d_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_V2D, v2d);
}